

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldblib.c
# Opt level: O2

int db_getinfo(lua_State *L)

{
  int iVar1;
  int iVar2;
  lua_State *L1;
  char *pcVar3;
  lua_Integer lVar4;
  char *pcVar5;
  int idx;
  int arg;
  lua_Debug ar;
  
  L1 = getthread(L,&arg);
  iVar2 = arg + 2;
  pcVar3 = luaL_optlstring(L,iVar2,"flnSrtu",(size_t *)0x0);
  checkstack(L,L1,3);
  if (*pcVar3 == '>') {
    luaL_argerror(L,iVar2,"invalid option \'>\'");
  }
  idx = arg + 1;
  iVar1 = lua_type(L,idx);
  if (iVar1 == 6) {
    pcVar3 = lua_pushfstring(L,">%s",pcVar3);
    lua_pushvalue(L,idx);
    lua_xmove(L,L1,1);
  }
  else {
    lVar4 = luaL_checkinteger(L,idx);
    iVar1 = lua_getstack(L1,(int)lVar4,&ar);
    if (iVar1 == 0) {
      lua_pushnil(L);
      return 1;
    }
  }
  iVar1 = lua_getinfo(L1,pcVar3,&ar);
  if (iVar1 == 0) {
    iVar2 = luaL_argerror(L,iVar2,"invalid option");
  }
  else {
    lua_createtable(L,0,0);
    pcVar5 = strchr(pcVar3,0x53);
    if (pcVar5 != (char *)0x0) {
      lua_pushlstring(L,ar.source,ar.srclen);
      lua_setfield(L,-2,"source");
      settabss(L,"short_src",ar.short_src);
      settabsi(L,"linedefined",ar.linedefined);
      settabsi(L,"lastlinedefined",ar.lastlinedefined);
      settabss(L,"what",ar.what);
    }
    pcVar5 = strchr(pcVar3,0x6c);
    if (pcVar5 != (char *)0x0) {
      settabsi(L,"currentline",ar.currentline);
    }
    pcVar5 = strchr(pcVar3,0x75);
    if (pcVar5 != (char *)0x0) {
      settabsi(L,"nups",(uint)ar.nups);
      settabsi(L,"nparams",(uint)ar.nparams);
      settabsb(L,"isvararg",(int)ar.isvararg);
    }
    pcVar5 = strchr(pcVar3,0x6e);
    if (pcVar5 != (char *)0x0) {
      settabss(L,"name",ar.name);
      settabss(L,"namewhat",ar.namewhat);
    }
    pcVar5 = strchr(pcVar3,0x72);
    if (pcVar5 != (char *)0x0) {
      settabsi(L,"ftransfer",(uint)ar.ftransfer);
      settabsi(L,"ntransfer",(uint)ar.ntransfer);
    }
    pcVar5 = strchr(pcVar3,0x74);
    if (pcVar5 != (char *)0x0) {
      settabsb(L,"istailcall",(int)ar.istailcall);
    }
    pcVar5 = strchr(pcVar3,0x4c);
    if (pcVar5 != (char *)0x0) {
      treatstackoption(L,L1,"activelines");
    }
    pcVar3 = strchr(pcVar3,0x66);
    iVar2 = 1;
    if (pcVar3 != (char *)0x0) {
      treatstackoption(L,L1,"func");
    }
  }
  return iVar2;
}

Assistant:

static int db_getinfo (lua_State *L) {
  lua_Debug ar;
  int arg;
  lua_State *L1 = getthread(L, &arg);
  const char *options = luaL_optstring(L, arg+2, "flnSrtu");
  checkstack(L, L1, 3);
  luaL_argcheck(L, options[0] != '>', arg + 2, "invalid option '>'");
  if (lua_isfunction(L, arg + 1)) {  /* info about a function? */
    options = lua_pushfstring(L, ">%s", options);  /* add '>' to 'options' */
    lua_pushvalue(L, arg + 1);  /* move function to 'L1' stack */
    lua_xmove(L, L1, 1);
  }
  else {  /* stack level */
    if (!lua_getstack(L1, (int)luaL_checkinteger(L, arg + 1), &ar)) {
      luaL_pushfail(L);  /* level out of range */
      return 1;
    }
  }
  if (!lua_getinfo(L1, options, &ar))
    return luaL_argerror(L, arg+2, "invalid option");
  lua_newtable(L);  /* table to collect results */
  if (strchr(options, 'S')) {
    lua_pushlstring(L, ar.source, ar.srclen);
    lua_setfield(L, -2, "source");
    settabss(L, "short_src", ar.short_src);
    settabsi(L, "linedefined", ar.linedefined);
    settabsi(L, "lastlinedefined", ar.lastlinedefined);
    settabss(L, "what", ar.what);
  }
  if (strchr(options, 'l'))
    settabsi(L, "currentline", ar.currentline);
  if (strchr(options, 'u')) {
    settabsi(L, "nups", ar.nups);
    settabsi(L, "nparams", ar.nparams);
    settabsb(L, "isvararg", ar.isvararg);
  }
  if (strchr(options, 'n')) {
    settabss(L, "name", ar.name);
    settabss(L, "namewhat", ar.namewhat);
  }
  if (strchr(options, 'r')) {
    settabsi(L, "ftransfer", ar.ftransfer);
    settabsi(L, "ntransfer", ar.ntransfer);
  }
  if (strchr(options, 't'))
    settabsb(L, "istailcall", ar.istailcall);
  if (strchr(options, 'L'))
    treatstackoption(L, L1, "activelines");
  if (strchr(options, 'f'))
    treatstackoption(L, L1, "func");
  return 1;  /* return table */
}